

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O3

bool OB::Color::valid(string *k)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *unaff_R15;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_68;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_48;
  
  if (k->_M_string_length == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)k);
    bVar1 = true;
    if ((((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)k), iVar2 != 0)) &&
        (iVar2 = std::__cxx11::string::compare((char *)k), iVar2 != 0)) &&
       ((iVar2 = std::__cxx11::string::compare((char *)k), iVar2 != 0 &&
        (iVar2 = std::__cxx11::string::compare((char *)k), iVar2 != 0)))) {
      if (k->_M_string_length == 0) {
        uVar4 = std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0
                          );
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(unaff_R15);
        _Unwind_Resume(uVar4);
      }
      if (*(k->_M_dataplus)._M_p == '#') {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&local_68,"^#[0-9a-fA-F]{3}(?:[0-9a-fA-F]{3})?$",0x10);
        bVar1 = String::assert_rx(k,&local_68);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_68);
        if (bVar1) {
          return true;
        }
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_48,"^[0-9]{1,3}$",0x10);
      bVar1 = String::assert_rx(k,&local_48);
      if ((bVar1) && (iVar2 = std::__cxx11::stoi(k,(size_t *)0x0,10), -1 < iVar2)) {
        iVar2 = std::__cxx11::stoi(k,(size_t *)0x0,10);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_48);
        if (iVar2 < 0x100) {
          return true;
        }
      }
      else {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_48);
      }
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&color_fg_abi_cxx11_._M_h,k);
      bVar1 = cVar3.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur != (__node_type *)0x0;
    }
  }
  return bVar1;
}

Assistant:

static bool valid(std::string const& k)
  {
    bool valid {false};

    if (! k.empty())
    {
      if (k == "clear")
      {
        valid = true;
      }
      else if (k == "reverse")
      {
        valid = true;
      }
      else if (k == "rainbow" || k == "candy" || k == "party")
      {
        valid = true;
      }
      else
      {
        // 24-bit color
        if (k.at(0) == '#' && OB::String::assert_rx(k,
          std::regex("^#[0-9a-fA-F]{3}(?:[0-9a-fA-F]{3})?$")))
        {
          valid = true;
        }

        // 8-bit color
        else if (OB::String::assert_rx(k, std::regex("^[0-9]{1,3}$")) &&
          std::stoi(k) >= 0 && std::stoi(k) <= 255)
        {
          valid = true;
        }

        // 4-bit color
        else if (color_fg.find(k) != color_fg.end())
        {
          valid = true;
        }
      }
    }

    return valid;
  }